

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

void __thiscall
slang::syntax::DPIImportSyntax::setChild(DPIImportSyntax *this,size_t index,TokenOrSyntax child)

{
  size_type sVar1;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *pSVar2;
  SyntaxNode *pSVar3;
  logic_error *this_00;
  Token TVar4;
  allocator<char> local_d9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if (index < 8) {
    switch(index) {
    case 0:
      pSVar3 = TokenOrSyntax::node(&child);
      pSVar2 = SyntaxNode::as<slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>>
                         (pSVar3);
      (this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent =
           (pSVar2->super_SyntaxListBase).super_SyntaxNode.parent;
      (this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind =
           (pSVar2->super_SyntaxListBase).super_SyntaxNode.kind;
      (this->super_MemberSyntax).attributes.super_SyntaxListBase.childCount =
           (pSVar2->super_SyntaxListBase).childCount;
      sVar1 = (pSVar2->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>)
              .size_;
      (this->super_MemberSyntax).attributes.
      super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.data_ =
           (pSVar2->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>).
           data_;
      (this->super_MemberSyntax).attributes.
      super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.size_ = sVar1;
      break;
    case 1:
      TVar4 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
      (this->keyword).kind = TVar4.kind;
      (this->keyword).field_0x2 = TVar4._2_1_;
      (this->keyword).numFlags = (NumericTokenFlags)TVar4.numFlags.raw;
      (this->keyword).rawLen = TVar4.rawLen;
      (this->keyword).info = TVar4.info;
      break;
    case 2:
      TVar4 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
      (this->specString).kind = TVar4.kind;
      (this->specString).field_0x2 = TVar4._2_1_;
      (this->specString).numFlags = (NumericTokenFlags)TVar4.numFlags.raw;
      (this->specString).rawLen = TVar4.rawLen;
      (this->specString).info = TVar4.info;
      break;
    case 3:
      TVar4 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
      (this->property).kind = TVar4.kind;
      (this->property).field_0x2 = TVar4._2_1_;
      (this->property).numFlags = (NumericTokenFlags)TVar4.numFlags.raw;
      (this->property).rawLen = TVar4.rawLen;
      (this->property).info = TVar4.info;
      break;
    case 4:
      TVar4 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
      (this->c_identifier).kind = TVar4.kind;
      (this->c_identifier).field_0x2 = TVar4._2_1_;
      (this->c_identifier).numFlags = (NumericTokenFlags)TVar4.numFlags.raw;
      (this->c_identifier).rawLen = TVar4.rawLen;
      (this->c_identifier).info = TVar4.info;
      break;
    case 5:
      TVar4 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
      (this->equals).kind = TVar4.kind;
      (this->equals).field_0x2 = TVar4._2_1_;
      (this->equals).numFlags = (NumericTokenFlags)TVar4.numFlags.raw;
      (this->equals).rawLen = TVar4.rawLen;
      (this->equals).info = TVar4.info;
      break;
    case 6:
      pSVar3 = TokenOrSyntax::node(&child);
      if (pSVar3 == (SyntaxNode *)0x0) {
        local_d8._M_dataplus._M_p = (pointer)0x0;
      }
      else {
        pSVar3 = TokenOrSyntax::node(&child);
        local_d8._M_dataplus._M_p =
             (pointer)SyntaxNode::as<slang::syntax::FunctionPrototypeSyntax>(pSVar3);
      }
      not_null<slang::syntax::FunctionPrototypeSyntax*>::
      not_null<slang::syntax::FunctionPrototypeSyntax*,void>
                ((not_null<slang::syntax::FunctionPrototypeSyntax*> *)&local_b8,
                 (FunctionPrototypeSyntax **)&local_d8);
      (this->method).ptr = (FunctionPrototypeSyntax *)local_b8._M_dataplus._M_p;
      break;
    case 7:
      TVar4 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
      (this->semi).kind = TVar4.kind;
      (this->semi).field_0x2 = TVar4._2_1_;
      (this->semi).numFlags = (NumericTokenFlags)TVar4.numFlags.raw;
      (this->semi).rawLen = TVar4.rawLen;
      (this->semi).info = TVar4.info;
    }
    return;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/build_O2/extern/slang/source/AllSyntax.cpp"
             ,&local_d9);
  std::operator+(&local_58,&local_78,":");
  std::__cxx11::to_string(&local_98,0xe10);
  std::operator+(&local_38,&local_58,&local_98);
  std::operator+(&local_d8,&local_38,": ");
  std::operator+(&local_b8,&local_d8,"Default case should be unreachable!");
  std::logic_error::logic_error(this_00,(string *)&local_b8);
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

void DPIImportSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: attributes = child.node()->as<SyntaxList<AttributeInstanceSyntax>>(); return;
        case 1: keyword = child.token(); return;
        case 2: specString = child.token(); return;
        case 3: property = child.token(); return;
        case 4: c_identifier = child.token(); return;
        case 5: equals = child.token(); return;
        case 6: method = child.node() ? &child.node()->as<FunctionPrototypeSyntax>() : nullptr; return;
        case 7: semi = child.token(); return;
        default: ASSUME_UNREACHABLE;
    }
}